

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Worker threadfunc;
  undefined8 uVar2;
  state_data sVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> results;
  string vw_init_string_parser;
  string vw_init_string_all;
  ezexample ex;
  string local_2d0;
  int local_2ac;
  vector<double,_std::allocator<double>_> local_2a8;
  vw *local_290;
  string local_288;
  undefined1 *local_268;
  long local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  vw *local_1e8;
  undefined8 uStack_1e0;
  vector<double,_std::allocator<double>_> *local_1d8;
  string *psStack_1d0;
  string local_1c8;
  undefined1 local_1a8 [24];
  state_data local_190;
  bool local_53;
  
  if (argc == 3) {
    local_2ac = atoi(argv[1]);
    runcount = atoi(argv[2]);
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,
               "-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w","");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,
               "-t --ldf_override s --quiet -q st --noconstant --hash all --noop","");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,local_268,local_268 + local_260);
    local_290 = VW::initialize(&local_1c8,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    ezexample::ezexample((ezexample *)local_1a8,local_290,false,(vw *)0x0);
    ezexample::addns((ezexample *)local_1a8,'s');
    paVar1 = &local_2d0.field_2;
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"p^the_man","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^the","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^man","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    ezexample::addns((ezexample *)local_1a8,'t');
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"p^le_homme","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^le","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^homme","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"1","");
    sVar3 = local_190;
    uVar2 = local_1a8._8_8_;
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_208,local_208 + local_200);
    VW::parse_example_label((vw *)uVar2,(example *)sVar3,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_53 = true;
    if (local_208 != local_1f8) {
      operator_delete(local_208);
    }
    ezexample::setup_for_predict((ezexample *)local_1a8);
    local_2d0._M_dataplus._M_p = (pointer)(double)*(float *)((long)local_190 + 0x68a8);
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_2a8,
                 (iterator)
                 local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_2d0);
    }
    else {
      *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_2d0._M_dataplus._M_p;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"should be near zero = ",0x16);
    ezexample::setup_for_predict((ezexample *)local_1a8);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)local_190 + 0x68a8));
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    ezexample::remns((ezexample *)local_1a8);
    ezexample::addns((ezexample *)local_1a8,'t');
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"p^un_homme","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^un","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^homme","");
    ezexample::addf((ezexample *)local_1a8,&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"1","");
    sVar3 = local_190;
    uVar2 = local_1a8._8_8_;
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_228,local_228 + local_220);
    VW::parse_example_label((vw *)uVar2,(example *)sVar3,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_53 = true;
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
    ezexample::setup_for_predict((ezexample *)local_1a8);
    local_2d0._M_dataplus._M_p = (pointer)(double)*(float *)((long)local_190 + 0x68a8);
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_2a8,
                 (iterator)
                 local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_2d0);
    }
    else {
      *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_2d0._M_dataplus._M_p;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"should be near one  = ",0x16);
    ezexample::setup_for_predict((ezexample *)local_1a8);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)local_190 + 0x68a8));
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    ezexample::remns((ezexample *)local_1a8);
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"p^un_homme","");
    ezexample::addf((ezexample *)local_1a8,'t',&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^un","");
    ezexample::addf((ezexample *)local_1a8,'t',&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"w^homme","");
    ezexample::addf((ezexample *)local_1a8,'t',&local_2d0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"1","");
    sVar3 = local_190;
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2d0,local_248,local_248 + local_240);
    VW::parse_example_label((vw *)local_1a8._8_8_,(example *)sVar3,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    local_53 = true;
    if (local_248 != local_238) {
      operator_delete(local_248);
    }
    ezexample::setup_for_predict((ezexample *)local_1a8);
    local_2d0._M_dataplus._M_p = (pointer)(double)*(float *)((long)local_190 + 0x68a8);
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_2a8,
                 (iterator)
                 local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_2d0);
    }
    else {
      *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_2d0._M_dataplus._M_p;
      local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"should be near one  = ",0x16);
    ezexample::setup_for_predict((ezexample *)local_1a8);
    poVar4 = std::ostream::_M_insert<double>((double)*(float *)((long)local_190 + 0x68a8));
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    ezexample::~ezexample((ezexample *)local_1a8);
    if (local_2ac == 0) {
      local_1a8._0_8_ = local_290;
      local_1a8._16_8_ = &local_2a8;
      local_190 = (state_data)&local_288;
      Worker::operator()((Worker *)local_1a8);
    }
    else {
      boost::thread_group::thread_group((thread_group *)local_1a8);
      if (0 < local_2ac) {
        iVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"starting thread ",0x10);
          plVar5 = (long *)std::ostream::operator<<(&std::cerr,iVar6);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
          local_1e8 = local_290;
          psStack_1d0 = &local_288;
          threadfunc.m_vw_parser = (vw *)uStack_1e0;
          threadfunc.m_vw = local_290;
          threadfunc.m_referenceValues = &local_2a8;
          threadfunc.vw_init_string = psStack_1d0;
          local_1d8 = &local_2a8;
          boost::thread_group::create_thread<Worker>((thread_group *)local_1a8,threadfunc);
          iVar6 = iVar6 + 1;
        } while (local_2ac != iVar6);
      }
      boost::thread_group::join_all((thread_group *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"finished!",9);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      boost::thread_group::~thread_group((thread_group *)local_1a8);
    }
    VW::finish(local_290,true);
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if (local_268 != local_258) {
      operator_delete(local_268);
    }
    iVar6 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"need two args: threadcount runcount",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{ if (argc != 3)
  { cerr << "need two args: threadcount runcount" << endl;
    return 1;
  }
  int threadcount = atoi(argv[1]);
  runcount = atoi(argv[2]);
  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS READS IN A MODEL FROM train.w
  string vw_init_string_all    = "-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w";
  string vw_init_string_parser = "-t --ldf_override s --quiet -q st --noconstant --hash all --noop";   // this needs to have enough arguments to get the parser right
  vw*vw = VW::initialize(vw_init_string_all);
  vector<double> results;

  // HAL'S SPIFFY INTERFACE USING C++ CRAZINESS
  { ezexample ex(vw, false);
    ex(vw_namespace('s'))
    ("p^the_man")
    ("w^the")
    ("w^man")
    (vw_namespace('t'))
    ("p^le_homme")
    ("w^le")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near zero = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    ex(vw_namespace('t'))
    ("p^un_homme")
    ("w^un")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    // add features with explicit ns
    ex('t', "p^un_homme")
    ('t', "w^un")
    ('t', "w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;
  }

  if (threadcount == 0)
  { Worker w(*vw, vw_init_string_parser, results);
    w();
  }
  else
  { boost::thread_group tg;
    for (int t = 0; t < threadcount; ++t)
    { cerr << "starting thread " << t << endl;
      boost::thread * pt = tg.create_thread(Worker(*vw, vw_init_string_parser, results));
    }
    tg.join_all();
    cerr << "finished!" << endl;
  }


  // AND FINISH UP
  VW::finish(*vw);
}